

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O1

void * ResponseHandleRun(void *args)

{
  int iVar1;
  int __fd;
  ssize_t sVar2;
  size_t sVar3;
  _Rb_tree_node_base *p_Var4;
  char *pcVar5;
  _Self __tmp;
  socklen_t len_client;
  sockaddr_in addr_client;
  char write_buf [4096];
  char buf [4096];
  socklen_t local_204c;
  sockaddr local_2048;
  char local_2038 [4096];
  undefined1 local_1038 [4104];
  
  memset(local_1038,0,0x1000);
  local_204c = 0x10;
  local_2048.sa_family = 0;
  local_2048.sa_data[0] = '\0';
  local_2048.sa_data[1] = '\0';
  local_2048.sa_data[2] = '\0';
  local_2048.sa_data[3] = '\0';
  local_2048.sa_data[4] = '\0';
  local_2048.sa_data[5] = '\0';
  local_2048.sa_data[6] = '\0';
  local_2048.sa_data[7] = '\0';
  local_2048.sa_data[8] = '\0';
  local_2048.sa_data[9] = '\0';
  local_2048.sa_data[10] = '\0';
  local_2048.sa_data[0xb] = '\0';
  local_2048.sa_data[0xc] = '\0';
  local_2048.sa_data[0xd] = '\0';
  __fd = accept(*(int *)((long)args + 0x10),&local_2048,&local_204c);
  http_parser_init_(*(undefined8 *)((long)args + 0x178),0);
  *(void **)(*(long *)((long)args + 0x178) + 0x18) = args;
  do {
    sVar2 = recv(__fd,local_1038,0x1000,0);
    if (((int)sVar2 < 1) ||
       (http_parser_execute_(*(undefined8 *)((long)args + 0x178),&htp_hooks,local_1038),
       (*(byte *)(*(long *)((long)args + 0x178) + 0x17) & 0x7f) != 0)) break;
  } while (*args != '\x01');
  if (*args != '\x01') goto LAB_0011814d;
  iVar1 = *(int *)((long)args + 0x18);
  if (iVar1 < 400) {
    if (iVar1 < 300) {
      switch(iVar1) {
      case 200:
        pcVar5 = "200 OK";
        break;
      case 0xc9:
        pcVar5 = "201 Created";
        break;
      case 0xca:
        pcVar5 = "202 Accepted";
        break;
      case 0xcb:
        pcVar5 = "203 Non-Authoritative Information";
        break;
      case 0xcc:
        pcVar5 = "204 No Content";
        break;
      case 0xcd:
        pcVar5 = "205 Reset Content";
        break;
      case 0xce:
        pcVar5 = "206 Partial Content";
        break;
      default:
        if (iVar1 == 100) {
          pcVar5 = "100 Continue";
        }
        else {
          if (iVar1 != 0x65) goto switchD_00117ee3_default;
          pcVar5 = "101 Switching Protocols";
        }
      }
    }
    else {
      switch(iVar1) {
      case 300:
        pcVar5 = "300 Multiple Choices";
        break;
      case 0x12d:
        pcVar5 = "301 Moved Permanently";
        break;
      case 0x12e:
        pcVar5 = "302 Found";
        break;
      case 0x12f:
        pcVar5 = "303 See Other";
        break;
      case 0x130:
        pcVar5 = "304 Not Modified";
        break;
      case 0x131:
        pcVar5 = "305 Use Proxy";
        break;
      case 0x132:
        pcVar5 = "306 (Unused)";
        break;
      case 0x133:
        pcVar5 = "307 Temporary Redirect";
        break;
      default:
        goto switchD_00117ee3_default;
      }
    }
  }
  else {
    switch(iVar1) {
    case 400:
      pcVar5 = "400 Bad Request";
      break;
    case 0x191:
      pcVar5 = "401 Unauthorized";
      break;
    case 0x192:
      pcVar5 = "402 Payment Required";
      break;
    case 0x193:
      pcVar5 = "403 Forbidden";
      break;
    case 0x194:
      pcVar5 = "404 Not Found";
      break;
    case 0x195:
      pcVar5 = "405 Method Not Allowed";
      break;
    case 0x196:
      pcVar5 = "406 Not Acceptable";
      break;
    case 0x197:
      pcVar5 = "407 Proxy Authentication Required";
      break;
    case 0x198:
      pcVar5 = "408 Request Timeout";
      break;
    case 0x199:
      pcVar5 = "409 Conflict";
      break;
    case 0x19a:
      pcVar5 = "410 Gone";
      break;
    case 0x19b:
      pcVar5 = "411 Length Required";
      break;
    case 0x19c:
      pcVar5 = "412 Precondition Failed";
      break;
    case 0x19d:
      pcVar5 = "413 Request Entity Too Large";
      break;
    case 0x19e:
      pcVar5 = "414 Request-URI Too Long";
      break;
    case 0x19f:
      pcVar5 = "415 Unsupported Media Type";
      break;
    case 0x1a0:
      pcVar5 = "416 Requested Range Not Satisfiable";
      break;
    case 0x1a1:
      pcVar5 = "417 Expectation Failed";
      break;
    default:
      switch(iVar1) {
      case 500:
        pcVar5 = "500 Internal Server Error";
        break;
      case 0x1f5:
        pcVar5 = "501 Not Implemented";
        break;
      case 0x1f6:
        pcVar5 = "502 Bad Gateway";
        break;
      case 0x1f7:
        pcVar5 = "503 Service Unavailable";
        break;
      case 0x1f8:
        pcVar5 = "504 Gateway Timeout";
        break;
      case 0x1f9:
        pcVar5 = "505 HTTP Version Not Supported";
        break;
      default:
switchD_00117ee3_default:
        pcVar5 = "";
      }
    }
  }
  snprintf(local_2038,0x1000,"HTTP/1.1 %s\r\n",pcVar5);
  sVar3 = strlen(local_2038);
  write(__fd,local_2038,sVar3);
  p_Var4 = *(_Rb_tree_node_base **)((long)args + 0x118);
  if (p_Var4 != (_Rb_tree_node_base *)((long)args + 0x108)) {
    do {
      snprintf(local_2038,0x1000,"%s: %s\r\n",*(undefined8 *)(p_Var4 + 1),
               *(undefined8 *)(p_Var4 + 2));
      sVar3 = strlen(local_2038);
      write(__fd,local_2038,sVar3);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)((long)args + 0x108));
  }
  write(__fd,"\r\n",2);
  if (*(size_t *)((long)args + 0x68) != 0) {
    write(__fd,*(void **)((long)args + 0x60),*(size_t *)((long)args + 0x68));
  }
LAB_0011814d:
  close(*(int *)((long)args + 0x10));
  close(__fd);
  return (void *)0x0;
}

Assistant:

void * ResponseHandleRun(void* args) {
  HttpTestListener* client = (HttpTestListener*)args;
  char buf[4096] = {};
  HttpTestListener* handler = (HttpTestListener*)args;
  int fd_client = 0;
  socklen_t len_client = sizeof(sockaddr_in);  
  sockaddr_in addr_client = {};
  fd_client = accept(handler->fd_, (sockaddr*)&addr_client, &len_client);
  http_parser_init_(handler->parser_, HTTP_REQUEST);
  handler->parser_->data = client;
  for(;;) {
    int len = recv(fd_client, buf, sizeof(buf), 0);
    if(len <= 0) {
      break;
    }
    http_parser_execute_(client->parser_, &htp_hooks, buf, len);

    if(handler->parser_->http_errno != 0 || handler->is_request_complete_) {
      break;
    }
  }

  if(handler->is_request_complete_) {
    char write_buf[4096];
    snprintf(write_buf, sizeof(write_buf), "HTTP/1.1 %s\r\n", get_status_string(handler->response_status_code_, 0));
    write(fd_client, write_buf, strlen(write_buf));
    for(std::map<std::string, std::string>::iterator it = handler->map_response_header_.begin();
        it !=  handler->map_response_header_.end(); it++) {
      snprintf(write_buf, sizeof(write_buf), "%s: %s\r\n", it->first.c_str(), it->second.c_str());
      write(fd_client, write_buf, strlen(write_buf));
    }
    write(fd_client, "\r\n", 2);

    if(client->response_body_.size() > 0) {
      write(fd_client, client->response_body_.c_str(), client->response_body_.size());
    }

  }
out:
  close(handler->fd_);
  close(fd_client);
  return NULL;
}